

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

void __thiscall sznet::net::EventLoop::abortNotInLoopThread(EventLoop *this)

{
  char *pcVar1;
  LogStream *pLVar2;
  char **ppcVar3;
  int *in_FS_OFFSET;
  SourceFile file;
  Logger local_fe8;
  
  file._8_8_ = 0xd;
  file.m_data = "EventLoop.cpp";
  Logger::Logger(&local_fe8,file,0xe7,FATAL);
  if (0x2c < (uint)(((int)&local_fe8 + 0xfb0) - (int)local_fe8.m_impl.m_stream.m_buffer.m_cur)) {
    builtin_strncpy(local_fe8.m_impl.m_stream.m_buffer.m_cur,
                    "EventLoop::abortNotInLoopThread - EventLoop ",0x2c);
    local_fe8.m_impl.m_stream.m_buffer.m_cur = local_fe8.m_impl.m_stream.m_buffer.m_cur + 0x2c;
  }
  pLVar2 = LogStream::operator<<(&local_fe8.m_impl.m_stream,this);
  ppcVar3 = &(pLVar2->m_buffer).m_cur;
  pcVar1 = (pLVar2->m_buffer).m_cur;
  if (0x1d < (uint)((int)ppcVar3 - (int)pcVar1)) {
    builtin_strncpy(pcVar1," was created in m_threadId = ",0x1d);
    *ppcVar3 = *ppcVar3 + 0x1d;
  }
  pLVar2 = LogStream::operator<<(pLVar2,this->m_threadId);
  ppcVar3 = &(pLVar2->m_buffer).m_cur;
  pcVar1 = (pLVar2->m_buffer).m_cur;
  if (0x16 < (uint)((int)ppcVar3 - (int)pcVar1)) {
    builtin_strncpy(pcVar1,", current thread id = ",0x16);
    *ppcVar3 = *ppcVar3 + 0x16;
  }
  sznet::CurrentThread::t_cachedTid::__tls_init();
  if (*in_FS_OFFSET == 0) {
    CurrentThread::cacheTid();
  }
  sznet::CurrentThread::t_cachedTid::__tls_init();
  LogStream::operator<<(pLVar2,*in_FS_OFFSET);
  Logger::~Logger(&local_fe8);
  return;
}

Assistant:

void EventLoop::abortNotInLoopThread()
{
	LOG_FATAL << "EventLoop::abortNotInLoopThread - EventLoop " << this
		<< " was created in m_threadId = " << m_threadId
		<< ", current thread id = " << CurrentThread::tid();
}